

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ITracker_003a0f70;
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x13a230);
  return;
}

Assistant:

ITracker::~ITracker() = default;